

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O3

void __thiscall
asio::detail::object_pool<asio::detail::epoll_reactor::descriptor_state>::free
          (object_pool<asio::detail::epoll_reactor::descriptor_state> *this,void *__ptr)

{
  long lVar1;
  
  if (this->live_list_ == (descriptor_state *)__ptr) {
    this->live_list_ = *(descriptor_state **)((long)__ptr + 0x18);
  }
  lVar1 = *(long *)((long)__ptr + 0x18);
  if (*(long *)((long)__ptr + 0x20) != 0) {
    *(long *)(*(long *)((long)__ptr + 0x20) + 0x18) = lVar1;
  }
  if (lVar1 != 0) {
    *(undefined8 *)(lVar1 + 0x20) = *(undefined8 *)((long)__ptr + 0x20);
  }
  *(descriptor_state **)((long)__ptr + 0x18) = this->free_list_;
  *(undefined8 *)((long)__ptr + 0x20) = 0;
  this->free_list_ = (descriptor_state *)__ptr;
  return;
}

Assistant:

void free(Object* o)
  {
    if (live_list_ == o)
      live_list_ = object_pool_access::next(o);

    if (object_pool_access::prev(o))
    {
      object_pool_access::next(object_pool_access::prev(o))
        = object_pool_access::next(o);
    }

    if (object_pool_access::next(o))
    {
      object_pool_access::prev(object_pool_access::next(o))
        = object_pool_access::prev(o);
    }

    object_pool_access::next(o) = free_list_;
    object_pool_access::prev(o) = 0;
    free_list_ = o;
  }